

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchBigFixed(int iters,int nbytes,SearchImpl *search)

{
  char *pcVar1;
  StringPiece local_b8;
  string local_a8 [8];
  string t;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string regexp;
  string local_38 [8];
  string s;
  SearchImpl *search_local;
  int nbytes_local;
  int iters_local;
  
  StopBenchmarkTiming();
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::append((ulong)local_38,(char)(nbytes / 2));
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"^");
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::string(local_a8);
  MakeText((string *)local_a8,nbytes / 2);
  std::__cxx11::string::operator+=(local_38,local_a8);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  StringPiece::StringPiece(&local_b8,(string *)local_38);
  (*search)(iters,pcVar1,&local_b8,kUnanchored,true);
  SetBenchmarkBytesProcessed((long)iters * (long)nbytes);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SearchBigFixed(int iters, int nbytes, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  s.append(nbytes/2, 'x');
  string regexp = "^" + s + ".*$";
  string t;
  MakeText(&t, nbytes/2);
  s += t;
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp.c_str(), s, Prog::kUnanchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}